

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

void scep_dump_conf(void)

{
  char *__s;
  char *__s_00;
  char *__s_01;
  uint local_1dc;
  int i;
  char *names [22];
  char *chars [22];
  int flags [22];
  char *t_char;
  char *n_char;
  char *T_char;
  
  names[0x15] = c_char;
  memcpy(&stack0xfffffffffffffe28,&PTR_anon_var_dwarf_1817_00114c70,0xb0);
  __s = (char *)malloc(0x14);
  __s_00 = (char *)malloc(0x14);
  __s_01 = (char *)malloc(0x14);
  sprintf(__s,"%d",(ulong)(uint)T_num);
  sprintf(__s_00,"%d",(ulong)(uint)n_num);
  sprintf(__s_01,"%d",(ulong)(uint)t_num);
  printf("Dumping Configuration\n");
  for (local_1dc = 0; local_1dc < 0x16; local_1dc = local_1dc + 1) {
    if (flags[(long)(int)local_1dc + -2] != 0) {
      printf("Option: %s, Flag: %i, Value: %s\n",names[(long)(int)local_1dc + -1],
             (ulong)(uint)flags[(long)(int)local_1dc + -2],names[(long)(int)local_1dc + 0x15]);
    }
  }
  exit(0);
}

Assistant:

void scep_dump_conf() {

    char *T_char , *n_char, *t_char;
    int flags[] = {
        c_flag, i_flag, r_flag, d_flag, e_flag, E_flag, F_flag, w_flag, s_flag, l_flag, O_flag, n_flag, T_flag,
        k_flag, K_flag, L_flag, S_flag, p_flag, t_flag, u_flag, v_flag, R_flag
    };
    char *chars[] = {
        c_char, i_char, r_char, "true", e_char, E_char, F_char, w_char, s_char, l_char, O_char, "", "",
        k_char, K_char, L_char, S_char, p_char, "", url_char, "true", "true"
    };
    char *names[] = {
        "-c / CACertFile",
        "-i / CAIdentifier",
        "-r / CertReqFile",
        "-d / Debug",
        "-e / EncCertFile",
        "-E / EncAlgorithm",
        "-F / FingerPrint",
        "-w / GetCertFile od. GetCrlFile",
        "-s / GetCertSerial",
        "-l / LocalCertFile",
        "-O / SignCertFile",
        "-n / MaxPollCount",
        "-T / MaxPollTime",
        "-k / PrivateKeyFile",
        "-K / SignKeyFile",
        "-L / SelfSignedFile",
        "-S / SigAlgorithm",
        "-p / Proxy",
        "-t / PollInterval",
        "-u / URL",
        "-v / Verbose",
        "-R / Resume"
    };

    T_char = (char *) malloc(sizeof(char) * 20);
    n_char = (char *) malloc(sizeof(char) * 20);
    t_char = (char *) malloc(sizeof(char) * 20);
    sprintf(T_char, "%d", T_num);
    chars[12] = T_char;
    sprintf(n_char, "%d", n_num);
    chars[11] = n_char;
    sprintf(t_char, "%d", t_num);
    chars[18] = t_char;

    printf("Dumping Configuration\n");

    if(sizeof(chars)/sizeof(char *) == sizeof(names)/sizeof(char *)) {
        int i;
        for(i = 0; i<sizeof(flags)/sizeof(int); i++) {
            if(flags[i])
                printf("Option: %s, Flag: %i, Value: %s\n", names[i], flags[i], chars[i]);
        }
    } else {
        fprintf(stderr, "Length of Arrays does not match! Flags: %li, Chars: %li, Names: %li\n",
            sizeof(flags)/sizeof(int),
            sizeof(chars)/sizeof(char *),
            sizeof(names)/sizeof(char *)
        );
    }
    exit(0);
}